

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O3

bool CheckInputScripts(CTransaction *tx,TxValidationState *state,CCoinsViewCache *inputs,uint flags,
                      bool cacheSigStore,bool cacheFullScriptStore,
                      PrecomputedTransactionData *txdata,ValidationCache *validation_cache,
                      vector<CScriptCheck,_std::allocator<CScriptCheck>_> *pvChecks)

{
  pointer puVar1;
  pointer pCVar2;
  __atomic_base<unsigned_char> *p_Var3;
  uchar *puVar4;
  SignatureCache *pSVar5;
  uint uVar6;
  pointer puVar7;
  pointer pCVar8;
  uint256 e;
  bool bVar9;
  bool bVar10;
  CSHA256 *pCVar11;
  CTxOut *__args;
  long lVar12;
  pointer args;
  ulong uVar13;
  byte bVar14;
  pointer pCVar15;
  ValidationCache *pVVar16;
  ulong uVar17;
  uint uVar18;
  long in_FS_OFFSET;
  byte bVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  vector<CTxOut,_std::allocator<CTxOut>_> spent_outputs;
  CSHA256 hasher;
  uint256 hashCacheEntry;
  byte local_209;
  uint local_1cc;
  undefined1 local_1c8 [32];
  string local_1a8;
  string local_188;
  undefined1 local_168 [36];
  uint local_144;
  CTransaction *local_140;
  uint local_138;
  uint local_134;
  bool local_130;
  ScriptError local_12c;
  PrecomputedTransactionData *local_128;
  SignatureCache *local_120;
  CScriptCheck local_118;
  CSHA256 local_c0;
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  long local_38;
  
  bVar19 = 0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_1cc = flags;
  bVar9 = CTransaction::IsCoinBase(tx);
  bVar14 = 1;
  if (!bVar9) {
    if (pvChecks != (vector<CScriptCheck,_std::allocator<CScriptCheck>_> *)0x0) {
      std::vector<CScriptCheck,_std::allocator<CScriptCheck>_>::reserve
                (pvChecks,((long)(tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl
                                 .super__Vector_impl_data._M_finish -
                           (long)(tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl
                                 .super__Vector_impl_data._M_start >> 3) * 0x4ec4ec4ec4ec4ec5);
    }
    local_48 = (undefined1  [16])0x0;
    local_58 = (undefined1  [16])0x0;
    pVVar16 = validation_cache;
    pCVar11 = &local_c0;
    for (lVar12 = 0xd; lVar12 != 0; lVar12 = lVar12 + -1) {
      *(undefined8 *)pCVar11->s = *(undefined8 *)(pVVar16->m_script_execution_cache_hasher).s;
      pVVar16 = (ValidationCache *)((long)pVVar16 + (ulong)bVar19 * -0x10 + 8);
      pCVar11 = (CSHA256 *)((long)pCVar11 + (ulong)bVar19 * -0x10 + 8);
    }
    pCVar11 = CSHA256::Write(&local_c0,(uchar *)&tx->m_witness_hash,0x20);
    pCVar11 = CSHA256::Write(pCVar11,(uchar *)&local_1cc,4);
    CSHA256::Finalize(pCVar11,local_58);
    uVar13 = (ulong)(validation_cache->m_script_execution_cache).size;
    local_118.m_tx_out.nValue._4_4_ = (int)((uint)local_58._4_4_ * uVar13 >> 0x20);
    local_118.m_tx_out.nValue._0_4_ = (int)((uint)local_58._0_4_ * uVar13 >> 0x20);
    local_118.m_tx_out.scriptPubKey.super_CScriptBase._union._0_4_ =
         (int)((uint)local_58._8_4_ * uVar13 >> 0x20);
    local_118.m_tx_out.scriptPubKey.super_CScriptBase._union._4_4_ =
         (int)((uint)local_58._12_4_ * uVar13 >> 0x20);
    local_118.m_tx_out.scriptPubKey.super_CScriptBase._union._12_4_ =
         (int)((uint)local_48._4_4_ * uVar13 >> 0x20);
    local_118.m_tx_out.scriptPubKey.super_CScriptBase._union.indirect_contents.capacity =
         (int)((uint)local_48._0_4_ * uVar13 >> 0x20);
    local_118.m_tx_out.scriptPubKey.super_CScriptBase._union._16_4_ =
         (int)((uint)local_48._8_4_ * uVar13 >> 0x20);
    local_118.m_tx_out.scriptPubKey.super_CScriptBase._union._20_4_ =
         (int)((uint)local_48._12_4_ * uVar13 >> 0x20);
    puVar7 = (validation_cache->m_script_execution_cache).table.
             super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.super__Vector_impl_data.
             _M_start;
    lVar12 = 0;
    do {
      uVar6 = *(uint *)((long)&local_118.m_tx_out.nValue + lVar12);
      puVar1 = puVar7 + uVar6;
      puVar4 = (uchar *)((long)&puVar7[uVar6].super_base_blob<256U>.m_data + 0x10);
      auVar21[0] = -(*puVar4 == local_48[0]);
      auVar21[1] = -(puVar4[1] == local_48[1]);
      auVar21[2] = -(puVar4[2] == local_48[2]);
      auVar21[3] = -(puVar4[3] == local_48[3]);
      auVar21[4] = -(puVar4[4] == local_48[4]);
      auVar21[5] = -(puVar4[5] == local_48[5]);
      auVar21[6] = -(puVar4[6] == local_48[6]);
      auVar21[7] = -(puVar4[7] == local_48[7]);
      auVar21[8] = -(puVar4[8] == local_48[8]);
      auVar21[9] = -(puVar4[9] == local_48[9]);
      auVar21[10] = -(puVar4[10] == local_48[10]);
      auVar21[0xb] = -(puVar4[0xb] == local_48[0xb]);
      auVar21[0xc] = -(puVar4[0xc] == local_48[0xc]);
      auVar21[0xd] = -(puVar4[0xd] == local_48[0xd]);
      auVar21[0xe] = -(puVar4[0xe] == local_48[0xe]);
      auVar21[0xf] = -(puVar4[0xf] == local_48[0xf]);
      auVar20[0] = -((puVar1->super_base_blob<256U>).m_data._M_elems[0] == local_58[0]);
      auVar20[1] = -(*(uchar *)((long)&(puVar1->super_base_blob<256U>).m_data + 1) == local_58[1]);
      auVar20[2] = -(*(uchar *)((long)&(puVar1->super_base_blob<256U>).m_data + 2) == local_58[2]);
      auVar20[3] = -(*(uchar *)((long)&(puVar1->super_base_blob<256U>).m_data + 3) == local_58[3]);
      auVar20[4] = -(*(uchar *)((long)&(puVar1->super_base_blob<256U>).m_data + 4) == local_58[4]);
      auVar20[5] = -(*(uchar *)((long)&(puVar1->super_base_blob<256U>).m_data + 5) == local_58[5]);
      auVar20[6] = -(*(uchar *)((long)&(puVar1->super_base_blob<256U>).m_data + 6) == local_58[6]);
      auVar20[7] = -(*(uchar *)((long)&(puVar1->super_base_blob<256U>).m_data + 7) == local_58[7]);
      auVar20[8] = -(*(uchar *)((long)&(puVar1->super_base_blob<256U>).m_data + 8) == local_58[8]);
      auVar20[9] = -(*(uchar *)((long)&(puVar1->super_base_blob<256U>).m_data + 9) == local_58[9]);
      auVar20[10] = -(*(uchar *)((long)&(puVar1->super_base_blob<256U>).m_data + 10) == local_58[10]
                     );
      auVar20[0xb] = -(*(uchar *)((long)&(puVar1->super_base_blob<256U>).m_data + 0xb) ==
                      local_58[0xb]);
      auVar20[0xc] = -(*(uchar *)((long)&(puVar1->super_base_blob<256U>).m_data + 0xc) ==
                      local_58[0xc]);
      auVar20[0xd] = -(*(uchar *)((long)&(puVar1->super_base_blob<256U>).m_data + 0xd) ==
                      local_58[0xd]);
      auVar20[0xe] = -(*(uchar *)((long)&(puVar1->super_base_blob<256U>).m_data + 0xe) ==
                      local_58[0xe]);
      auVar20[0xf] = -(*(uchar *)((long)&(puVar1->super_base_blob<256U>).m_data + 0xf) ==
                      local_58[0xf]);
      auVar20 = auVar20 & auVar21;
      if ((ushort)((ushort)(SUB161(auVar20 >> 7,0) & 1) |
                   (ushort)(SUB161(auVar20 >> 0xf,0) & 1) << 1 |
                   (ushort)(SUB161(auVar20 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar20 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar20 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar20 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar20 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar20 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar20 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar20 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar20 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar20 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar20 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar20 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar20 >> 0x77,0) & 1) << 0xe |
                  (ushort)(byte)(auVar20[0xf] >> 7) << 0xf) == 0xffff) {
        if (!cacheFullScriptStore) {
          LOCK();
          p_Var3 = &(validation_cache->m_script_execution_cache).collection_flags.mem._M_t.
                    super___uniq_ptr_impl<std::atomic<unsigned_char>,_std::default_delete<std::atomic<unsigned_char>[]>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::atomic<unsigned_char>_*,_std::default_delete<std::atomic<unsigned_char>[]>_>
                    .super__Head_base<0UL,_std::atomic<unsigned_char>_*,_false>._M_head_impl
                    [uVar6 >> 3].super___atomic_base<unsigned_char>;
          p_Var3->_M_i = p_Var3->_M_i | (byte)(1 << ((byte)uVar6 & 7));
          UNLOCK();
        }
        bVar14 = 1;
        goto LAB_00ae9fda;
      }
      lVar12 = lVar12 + 4;
    } while (lVar12 != 0x20);
    if (txdata->m_spent_outputs_ready == false) {
      local_118.m_tx_out._0_16_ = (undefined1  [16])0x0;
      local_118.m_tx_out.scriptPubKey.super_CScriptBase._union._8_8_ = 0;
      std::vector<CTxOut,_std::allocator<CTxOut>_>::reserve
                ((vector<CTxOut,_std::allocator<CTxOut>_> *)&local_118,
                 ((long)(tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)(tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                        super__Vector_impl_data._M_start >> 3) * 0x4ec4ec4ec4ec4ec5);
      pCVar15 = (tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                super__Vector_impl_data._M_start;
      pCVar8 = (tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
               super__Vector_impl_data._M_finish;
      if (pCVar15 != pCVar8) {
        do {
          __args = &CCoinsViewCache::AccessCoin(inputs,&pCVar15->prevout)->out;
          if (__args->nValue == -1) {
            __assert_fail("!coin.IsSpent()",
                          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
                          ,0x875,
                          "bool CheckInputScripts(const CTransaction &, TxValidationState &, const CCoinsViewCache &, unsigned int, bool, bool, PrecomputedTransactionData &, ValidationCache &, std::vector<CScriptCheck> *)"
                         );
          }
          std::vector<CTxOut,std::allocator<CTxOut>>::emplace_back<CTxOut_const&>
                    ((vector<CTxOut,std::allocator<CTxOut>> *)&local_118,__args);
          pCVar15 = pCVar15 + 1;
        } while (pCVar15 != pCVar8);
      }
      PrecomputedTransactionData::Init<CTransaction>
                (txdata,tx,(vector<CTxOut,_std::allocator<CTxOut>_> *)&local_118,false);
      std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector
                ((vector<CTxOut,_std::allocator<CTxOut>_> *)&local_118);
    }
    pCVar15 = (tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
              super__Vector_impl_data._M_start;
    pCVar8 = (tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (((long)(txdata->m_spent_outputs).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl
               .super__Vector_impl_data._M_finish -
         (long)(txdata->m_spent_outputs).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl
               .super__Vector_impl_data._M_start >> 3) * -0x3333333333333333 +
        ((long)pCVar8 - (long)pCVar15 >> 3) * -0x4ec4ec4ec4ec4ec5 != 0) {
      __assert_fail("txdata.m_spent_outputs.size() == tx.vin.size()",
                    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
                    ,0x87a,
                    "bool CheckInputScripts(const CTransaction &, TxValidationState &, const CCoinsViewCache &, unsigned int, bool, bool, PrecomputedTransactionData &, ValidationCache &, std::vector<CScriptCheck> *)"
                   );
    }
    if (pCVar8 != pCVar15) {
      pSVar5 = &validation_cache->m_signature_cache;
      uVar13 = 0;
      uVar17 = 1;
      do {
        uVar6 = local_1cc;
        uVar18 = (int)uVar17 - 1;
        args = (txdata->m_spent_outputs).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl
               .super__Vector_impl_data._M_start;
        local_118.m_tx_out.nValue = *(undefined8 *)((long)(&args[uVar13].scriptPubKey + -1) + 0x18);
        prevector<28U,_unsigned_char,_unsigned_int,_int>::prevector
                  (&local_118.m_tx_out.scriptPubKey.super_CScriptBase,
                   &args[uVar13].scriptPubKey.super_CScriptBase);
        local_118.nFlags = uVar6;
        local_118.error = SCRIPT_ERR_UNKNOWN_ERROR;
        local_118.txdata = txdata;
        local_118.ptxTo = tx;
        local_118.nIn = uVar18;
        local_118.cacheStore = cacheSigStore;
        local_118.m_signature_cache = pSVar5;
        if (pvChecks == (vector<CScriptCheck,_std::allocator<CScriptCheck>_> *)0x0) {
          bVar10 = CScriptCheck::operator()(&local_118);
          uVar6 = local_1cc;
          bVar9 = true;
          if (!bVar10) {
            if ((local_1cc & 0x1df1ca) == 0) {
LAB_00ae9e2f:
              ScriptErrorString_abi_cxx11_(&local_188,local_118.error);
              tinyformat::format<std::__cxx11::string>
                        ((string *)local_168,
                         (tinyformat *)"mandatory-script-verify-flag-failed (%s)",(char *)&local_188
                         ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args)
              ;
              local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"");
              local_209 = ValidationState<TxValidationResult>::Invalid
                                    (&state->super_ValidationState<TxValidationResult>,TX_CONSENSUS,
                                     (string *)local_168,&local_1a8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
                operator_delete(local_1a8._M_dataplus._M_p,
                                local_1a8.field_2._M_allocated_capacity + 1);
              }
              if ((undefined1 *)local_168._0_8_ != local_168 + 0x10) {
                operator_delete((void *)local_168._0_8_,local_168._16_8_ + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_188._M_dataplus._M_p != &local_188.field_2) {
                operator_delete(local_188._M_dataplus._M_p,
                                local_188.field_2._M_allocated_capacity + 1);
              }
            }
            else {
              pCVar2 = (txdata->m_spent_outputs).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>
                       ._M_impl.super__Vector_impl_data._M_start + uVar13;
              local_168._0_8_ = pCVar2->nValue;
              prevector<28U,_unsigned_char,_unsigned_int,_int>::prevector
                        ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)(local_168 + 8),
                         &(pCVar2->scriptPubKey).super_CScriptBase);
              local_134 = uVar6 & 0xffe20e35;
              local_12c = SCRIPT_ERR_UNKNOWN_ERROR;
              local_128 = txdata;
              local_140 = tx;
              local_138 = uVar18;
              local_130 = cacheSigStore;
              local_120 = pSVar5;
              bVar9 = CScriptCheck::operator()((CScriptCheck *)local_168);
              if (bVar9) {
                ScriptErrorString_abi_cxx11_(&local_1a8,local_118.error);
                tinyformat::format<std::__cxx11::string>
                          (&local_188,(tinyformat *)"non-mandatory-script-verify-flag (%s)",
                           (char *)&local_1a8,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args
                          );
                local_1c8._0_8_ = local_1c8 + 0x10;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,"");
                args = (pointer)local_1c8;
                local_209 = ValidationState<TxValidationResult>::Invalid
                                      (&state->super_ValidationState<TxValidationResult>,
                                       TX_NOT_STANDARD,&local_188,(string *)local_1c8);
                if ((undefined1 *)local_1c8._0_8_ != local_1c8 + 0x10) {
                  operator_delete((void *)local_1c8._0_8_,local_1c8._16_8_ + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_188._M_dataplus._M_p != &local_188.field_2) {
                  operator_delete(local_188._M_dataplus._M_p,
                                  local_188.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
                  operator_delete(local_1a8._M_dataplus._M_p,
                                  local_1a8.field_2._M_allocated_capacity + 1);
                }
              }
              if (0x1c < local_144) {
                free((void *)local_168._8_8_);
              }
              if (!bVar9) goto LAB_00ae9e2f;
            }
            bVar9 = false;
          }
        }
        else {
          bVar9 = true;
          std::vector<CScriptCheck,_std::allocator<CScriptCheck>_>::emplace_back<CScriptCheck>
                    (pvChecks,&local_118);
        }
        if (0x1c < local_118.m_tx_out.scriptPubKey.super_CScriptBase._size) {
          free(local_118.m_tx_out.scriptPubKey.super_CScriptBase._union.indirect_contents.indirect);
        }
        bVar14 = local_209;
        if (!bVar9) goto LAB_00ae9fda;
        uVar13 = ((long)(tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)(tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                        super__Vector_impl_data._M_start >> 3) * 0x4ec4ec4ec4ec4ec5;
        bVar9 = uVar17 <= uVar13;
        lVar12 = uVar13 - uVar17;
        uVar13 = uVar17;
        uVar17 = (ulong)((int)uVar17 + 1);
      } while (bVar9 && lVar12 != 0);
    }
    auVar20 = local_48;
    bVar14 = 1;
    if (cacheFullScriptStore &&
        pvChecks == (vector<CScriptCheck,_std::allocator<CScriptCheck>_> *)0x0) {
      e.super_base_blob<256U>.m_data._M_elems[0x10] = local_48[0];
      e.super_base_blob<256U>.m_data._M_elems[0x11] = local_48[1];
      e.super_base_blob<256U>.m_data._M_elems[0x12] = local_48[2];
      e.super_base_blob<256U>.m_data._M_elems[0x13] = local_48[3];
      e.super_base_blob<256U>.m_data._M_elems[0x14] = local_48[4];
      e.super_base_blob<256U>.m_data._M_elems[0x15] = local_48[5];
      e.super_base_blob<256U>.m_data._M_elems[0x16] = local_48[6];
      e.super_base_blob<256U>.m_data._M_elems[0x17] = local_48[7];
      e.super_base_blob<256U>.m_data._M_elems[0] = local_58[0];
      e.super_base_blob<256U>.m_data._M_elems[1] = local_58[1];
      e.super_base_blob<256U>.m_data._M_elems[2] = local_58[2];
      e.super_base_blob<256U>.m_data._M_elems[3] = local_58[3];
      e.super_base_blob<256U>.m_data._M_elems[4] = local_58[4];
      e.super_base_blob<256U>.m_data._M_elems[5] = local_58[5];
      e.super_base_blob<256U>.m_data._M_elems[6] = local_58[6];
      e.super_base_blob<256U>.m_data._M_elems[7] = local_58[7];
      e.super_base_blob<256U>.m_data._M_elems[8] = local_58[8];
      e.super_base_blob<256U>.m_data._M_elems[9] = local_58[9];
      e.super_base_blob<256U>.m_data._M_elems[10] = local_58[10];
      e.super_base_blob<256U>.m_data._M_elems[0xb] = local_58[0xb];
      e.super_base_blob<256U>.m_data._M_elems[0xc] = local_58[0xc];
      e.super_base_blob<256U>.m_data._M_elems[0xd] = local_58[0xd];
      e.super_base_blob<256U>.m_data._M_elems[0xe] = local_58[0xe];
      e.super_base_blob<256U>.m_data._M_elems[0xf] = local_58[0xf];
      e.super_base_blob<256U>.m_data._M_elems[0x18] = local_48[8];
      e.super_base_blob<256U>.m_data._M_elems[0x19] = local_48[9];
      e.super_base_blob<256U>.m_data._M_elems[0x1a] = local_48[10];
      e.super_base_blob<256U>.m_data._M_elems[0x1b] = local_48[0xb];
      e.super_base_blob<256U>.m_data._M_elems[0x1c] = local_48[0xc];
      e.super_base_blob<256U>.m_data._M_elems[0x1d] = local_48[0xd];
      e.super_base_blob<256U>.m_data._M_elems[0x1e] = local_48[0xe];
      e.super_base_blob<256U>.m_data._M_elems[0x1f] = local_48[0xf];
      local_48 = auVar20;
      CuckooCache::cache<uint256,_SignatureCacheHasher>::insert
                (&validation_cache->m_script_execution_cache,e);
    }
  }
LAB_00ae9fda:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return (bool)(bVar14 & 1);
}

Assistant:

bool CheckInputScripts(const CTransaction& tx, TxValidationState& state,
                       const CCoinsViewCache& inputs, unsigned int flags, bool cacheSigStore,
                       bool cacheFullScriptStore, PrecomputedTransactionData& txdata,
                       ValidationCache& validation_cache,
                       std::vector<CScriptCheck>* pvChecks)
{
    if (tx.IsCoinBase()) return true;

    if (pvChecks) {
        pvChecks->reserve(tx.vin.size());
    }

    // First check if script executions have been cached with the same
    // flags. Note that this assumes that the inputs provided are
    // correct (ie that the transaction hash which is in tx's prevouts
    // properly commits to the scriptPubKey in the inputs view of that
    // transaction).
    uint256 hashCacheEntry;
    CSHA256 hasher = validation_cache.ScriptExecutionCacheHasher();
    hasher.Write(UCharCast(tx.GetWitnessHash().begin()), 32).Write((unsigned char*)&flags, sizeof(flags)).Finalize(hashCacheEntry.begin());
    AssertLockHeld(cs_main); //TODO: Remove this requirement by making CuckooCache not require external locks
    if (validation_cache.m_script_execution_cache.contains(hashCacheEntry, !cacheFullScriptStore)) {
        return true;
    }

    if (!txdata.m_spent_outputs_ready) {
        std::vector<CTxOut> spent_outputs;
        spent_outputs.reserve(tx.vin.size());

        for (const auto& txin : tx.vin) {
            const COutPoint& prevout = txin.prevout;
            const Coin& coin = inputs.AccessCoin(prevout);
            assert(!coin.IsSpent());
            spent_outputs.emplace_back(coin.out);
        }
        txdata.Init(tx, std::move(spent_outputs));
    }
    assert(txdata.m_spent_outputs.size() == tx.vin.size());

    for (unsigned int i = 0; i < tx.vin.size(); i++) {

        // We very carefully only pass in things to CScriptCheck which
        // are clearly committed to by tx' witness hash. This provides
        // a sanity check that our caching is not introducing consensus
        // failures through additional data in, eg, the coins being
        // spent being checked as a part of CScriptCheck.

        // Verify signature
        CScriptCheck check(txdata.m_spent_outputs[i], tx, validation_cache.m_signature_cache, i, flags, cacheSigStore, &txdata);
        if (pvChecks) {
            pvChecks->emplace_back(std::move(check));
        } else if (!check()) {
            if (flags & STANDARD_NOT_MANDATORY_VERIFY_FLAGS) {
                // Check whether the failure was caused by a
                // non-mandatory script verification check, such as
                // non-standard DER encodings or non-null dummy
                // arguments; if so, ensure we return NOT_STANDARD
                // instead of CONSENSUS to avoid downstream users
                // splitting the network between upgraded and
                // non-upgraded nodes by banning CONSENSUS-failing
                // data providers.
                CScriptCheck check2(txdata.m_spent_outputs[i], tx, validation_cache.m_signature_cache, i,
                        flags & ~STANDARD_NOT_MANDATORY_VERIFY_FLAGS, cacheSigStore, &txdata);
                if (check2())
                    return state.Invalid(TxValidationResult::TX_NOT_STANDARD, strprintf("non-mandatory-script-verify-flag (%s)", ScriptErrorString(check.GetScriptError())));
            }
            // MANDATORY flag failures correspond to
            // TxValidationResult::TX_CONSENSUS. Because CONSENSUS
            // failures are the most serious case of validation
            // failures, we may need to consider using
            // RECENT_CONSENSUS_CHANGE for any script failure that
            // could be due to non-upgraded nodes which we may want to
            // support, to avoid splitting the network (but this
            // depends on the details of how net_processing handles
            // such errors).
            return state.Invalid(TxValidationResult::TX_CONSENSUS, strprintf("mandatory-script-verify-flag-failed (%s)", ScriptErrorString(check.GetScriptError())));
        }
    }

    if (cacheFullScriptStore && !pvChecks) {
        // We executed all of the provided scripts, and were told to
        // cache the result. Do so now.
        validation_cache.m_script_execution_cache.insert(hashCacheEntry);
    }

    return true;
}